

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.cpp
# Opt level: O3

void mbedtls_pem_free(mbedtls_pem_context *ctx)

{
  if (ctx != (mbedtls_pem_context *)0x0) {
    if (ctx->buf != (uchar *)0x0) {
      mbedtls_zeroize_and_free(ctx->buf,ctx->buflen);
    }
    free(ctx->info);
    mbedtls_platform_zeroize(ctx,0x18);
    return;
  }
  return;
}

Assistant:

void mbedtls_pem_free(mbedtls_pem_context *ctx)
{
    if (ctx == NULL) {
        return;
    }

    if (ctx->buf != NULL) {
        mbedtls_zeroize_and_free(ctx->buf, ctx->buflen);
    }
    mbedtls_free(ctx->info);

    mbedtls_platform_zeroize(ctx, sizeof(mbedtls_pem_context));
}